

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

void __thiscall SynthWidget::on_pinCheckBox_stateChanged(SynthWidget *this,int state)

{
  bool bVar1;
  Master *this_00;
  Master *master;
  int state_local;
  SynthWidget *this_local;
  
  this_00 = Master::getInstance();
  if (state == 2) {
    Master::setPinned(this_00,this->synthRoute);
  }
  else if ((state == 0) && (bVar1 = Master::isPinned(this_00,this->synthRoute), bVar1)) {
    Master::setPinned(this_00,(SynthRoute *)0x0);
  }
  return;
}

Assistant:

void SynthWidget::on_pinCheckBox_stateChanged(int state)
{
	Master *master = Master::getInstance();
	if (state == Qt::Checked) {
		master->setPinned(synthRoute);
	} else if (state == Qt::Unchecked && master->isPinned(synthRoute)) {
		master->setPinned(NULL);
	}
}